

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_auto_choose_color
               (LodePNGColorMode *mode_out,uchar *image,uint w,uint h,LodePNGColorMode *mode_in)

{
  bool bVar1;
  undefined4 uVar2;
  uint uVar3;
  int in_ECX;
  int in_EDX;
  undefined4 *in_RDI;
  int *in_R8;
  uint mask;
  uchar *p;
  uint palette_ok;
  uint grey_ok;
  uint palettebits;
  uint n;
  uint i;
  uint error;
  LodePNGColorProfile prof;
  undefined4 in_stack_fffffffffffffb80;
  uchar in_stack_fffffffffffffb84;
  uchar in_stack_fffffffffffffb85;
  uchar in_stack_fffffffffffffb86;
  uchar r;
  uint in_stack_fffffffffffffb88;
  uint uVar4;
  uint local_44c;
  uint local_448;
  uint local_444;
  uint local_440;
  ushort local_43c;
  ushort local_43a;
  ushort local_438;
  uint local_434;
  uint local_430;
  LodePNGColorMode *in_stack_fffffffffffffc78;
  uint in_stack_fffffffffffffc80;
  uint in_stack_fffffffffffffc84;
  uchar *in_stack_fffffffffffffc88;
  LodePNGColorProfile *in_stack_fffffffffffffc90;
  uint local_2c;
  uint local_4;
  
  lodepng_color_profile_init((LodePNGColorProfile *)&local_444);
  local_448 = lodepng_get_color_profile
                        (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                         in_stack_fffffffffffffc84,in_stack_fffffffffffffc80,
                         in_stack_fffffffffffffc78);
  local_4 = local_448;
  if (local_448 == 0) {
    in_RDI[6] = 0;
    if (((local_440 != 0) && ((uint)(in_EDX * in_ECX) < 0x11)) && (local_434 = 1, local_2c < 8)) {
      local_2c = 8;
    }
    if (local_430 < 3) {
      uVar3 = 1;
    }
    else if (local_430 < 5) {
      in_stack_fffffffffffffb88 = 2;
      uVar3 = in_stack_fffffffffffffb88;
    }
    else {
      in_stack_fffffffffffffb88 = 8;
      uVar3 = in_stack_fffffffffffffb88;
      if (local_430 < 0x11) {
        in_stack_fffffffffffffb88 = 4;
        uVar3 = in_stack_fffffffffffffb88;
      }
    }
    r = false;
    if ((local_430 < 0x101) && (r = false, local_430 << 1 < (uint)(in_EDX * in_ECX))) {
      r = local_2c < 9;
    }
    bVar1 = (bool)r;
    if ((uint)(in_EDX * in_ECX) < local_430 << 1) {
      bVar1 = false;
    }
    if ((local_444 == 0 && local_434 == 0) && (local_2c <= uVar3)) {
      bVar1 = false;
    }
    if (bVar1 == false) {
      in_RDI[1] = local_2c;
      if (local_434 == 0) {
        uVar2 = 0;
        if (local_444 != 0) {
          uVar2 = 2;
        }
      }
      else {
        uVar2 = 4;
        if (local_444 != 0) {
          uVar2 = 6;
        }
      }
      *in_RDI = uVar2;
      if ((local_440 != 0) && (local_434 == 0)) {
        uVar3 = (1 << ((byte)in_RDI[1] & 0x1f)) - 1;
        in_RDI[7] = local_43c & uVar3;
        in_RDI[8] = local_43a & uVar3;
        in_RDI[9] = local_438 & uVar3;
        in_RDI[6] = 1;
      }
    }
    else {
      uVar4 = uVar3;
      lodepng_palette_clear((LodePNGColorMode *)0x2b3f15);
      local_44c = 0;
      while ((local_44c != local_430 &&
             (local_448 = lodepng_palette_add((LodePNGColorMode *)
                                              CONCAT44(uVar4,in_stack_fffffffffffffb88),r,
                                              in_stack_fffffffffffffb86,in_stack_fffffffffffffb85,
                                              in_stack_fffffffffffffb84), local_448 == 0))) {
        local_44c = local_44c + 1;
      }
      *in_RDI = 3;
      in_RDI[1] = uVar3;
      if (((*in_R8 == 3) && (*(ulong *)(in_RDI + 4) <= *(ulong *)(in_R8 + 4))) &&
         (in_R8[1] == in_RDI[1])) {
        lodepng_color_mode_cleanup((LodePNGColorMode *)0x2b4021);
        lodepng_color_mode_copy
                  ((LodePNGColorMode *)CONCAT44(uVar4,in_stack_fffffffffffffb88),
                   (LodePNGColorMode *)
                   CONCAT17(r,CONCAT16(in_stack_fffffffffffffb86,
                                       CONCAT15(in_stack_fffffffffffffb85,
                                                CONCAT14(in_stack_fffffffffffffb84,
                                                         in_stack_fffffffffffffb80)))));
      }
    }
    local_4 = local_448;
  }
  return local_4;
}

Assistant:

unsigned lodepng_auto_choose_color(LodePNGColorMode* mode_out,
                                   const unsigned char* image, unsigned w, unsigned h,
                                   const LodePNGColorMode* mode_in)
{
  LodePNGColorProfile prof;
  unsigned error = 0;
  unsigned i, n, palettebits, grey_ok, palette_ok;

  lodepng_color_profile_init(&prof);
  error = lodepng_get_color_profile(&prof, image, w, h, mode_in);
  if(error) return error;
  mode_out->key_defined = 0;

  if(prof.key && w * h <= 16)
  {
    prof.alpha = 1; /*too few pixels to justify tRNS chunk overhead*/
    if(prof.bits < 8) prof.bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
  }
  grey_ok = !prof.colored && !prof.alpha; /*grey without alpha, with potentially low bits*/
  n = prof.numcolors;
  palettebits = n <= 2 ? 1 : (n <= 4 ? 2 : (n <= 16 ? 4 : 8));
  palette_ok = n <= 256 && (n * 2 < w * h) && prof.bits <= 8;
  if(w * h < n * 2) palette_ok = 0; /*don't add palette overhead if image has only a few pixels*/
  if(grey_ok && prof.bits <= palettebits) palette_ok = 0; /*grey is less overhead*/

  if(palette_ok)
  {
    unsigned char* p = prof.palette;
    lodepng_palette_clear(mode_out); /*remove potential earlier palette*/
    for(i = 0; i != prof.numcolors; ++i)
    {
      error = lodepng_palette_add(mode_out, p[i * 4 + 0], p[i * 4 + 1], p[i * 4 + 2], p[i * 4 + 3]);
      if(error) break;
    }

    mode_out->colortype = LCT_PALETTE;
    mode_out->bitdepth = palettebits;

    if(mode_in->colortype == LCT_PALETTE && mode_in->palettesize >= mode_out->palettesize
        && mode_in->bitdepth == mode_out->bitdepth)
    {
      /*If input should have same palette colors, keep original to preserve its order and prevent conversion*/
      lodepng_color_mode_cleanup(mode_out);
      lodepng_color_mode_copy(mode_out, mode_in);
    }
  }
  else /*8-bit or 16-bit per channel*/
  {
    mode_out->bitdepth = prof.bits;
    mode_out->colortype = prof.alpha ? (prof.colored ? LCT_RGBA : LCT_GREY_ALPHA)
                                     : (prof.colored ? LCT_RGB : LCT_GREY);

    if(prof.key && !prof.alpha)
    {
      unsigned mask = (1u << mode_out->bitdepth) - 1u; /*profile always uses 16-bit, mask converts it*/
      mode_out->key_r = prof.key_r & mask;
      mode_out->key_g = prof.key_g & mask;
      mode_out->key_b = prof.key_b & mask;
      mode_out->key_defined = 1;
    }
  }

  return error;
}